

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.cpp
# Opt level: O0

void __thiscall
oout::ContainTest::ContainTest
          (ContainTest *this,shared_ptr<const_oout::Text> *text,shared_ptr<const_oout::Match> *match
          )

{
  shared_ptr<const_oout::Text> local_30;
  shared_ptr<const_oout::Match> *local_20;
  shared_ptr<const_oout::Match> *match_local;
  shared_ptr<const_oout::Text> *text_local;
  ContainTest *this_local;
  
  local_20 = match;
  match_local = (shared_ptr<const_oout::Match> *)text;
  text_local = (shared_ptr<const_oout::Text> *)this;
  Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ContainTest_00324ed0;
  std::
  make_shared<oout::MatchTest,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::Match_const>const&>
            (&local_30,match_local);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::MatchTest,void>
            ((shared_ptr<oout::Test_const> *)&this->test,(shared_ptr<oout::MatchTest> *)&local_30);
  std::shared_ptr<oout::MatchTest>::~shared_ptr((shared_ptr<oout::MatchTest> *)&local_30);
  return;
}

Assistant:

ContainTest::ContainTest(
	const shared_ptr<const Text> &text,
	const shared_ptr<const Match> &match
) : test(make_shared<MatchTest>(text, match))
{
}